

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

bool IntBounds::IsGreaterThanOrEqualTo(int constantValue,int constantBoundBase,int offset)

{
  bool bVar1;
  int iVar2;
  
  if (offset == 1) {
    bVar1 = constantBoundBase < constantValue;
  }
  else if (offset == 0) {
    bVar1 = constantBoundBase <= constantValue;
  }
  else {
    iVar2 = offset + constantBoundBase;
    if (offset < 0) {
      bVar1 = constantBoundBase <= iVar2 || iVar2 <= constantValue;
    }
    else {
      bVar1 = constantBoundBase <= iVar2 && iVar2 <= constantValue;
    }
  }
  return bVar1;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const int constantValue, const int constantBoundBase, const int offset)
{
    if(offset == 0)
        return constantValue >= constantBoundBase;
    if(offset == 1)
        return constantValue > constantBoundBase;

    // use unsigned to avoid signed int overflow
    const int constantBound = (unsigned)constantBoundBase + (unsigned)offset;
    return
        offset >= 0
            ? constantBound >= constantBoundBase && constantValue >= constantBound
            : constantBound >= constantBoundBase || constantValue >= constantBound;
}